

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

void fixVarTree(MtrNode *treenode,int *perm,int size)

{
  MtrHalfWord local_20;
  int size_local;
  int *perm_local;
  MtrNode *treenode_local;
  
  treenode->index = treenode->low;
  if ((int)treenode->index < size) {
    local_20 = perm[treenode->index];
  }
  else {
    local_20 = treenode->index;
  }
  treenode->low = local_20;
  if (treenode->child != (MtrNode *)0x0) {
    fixVarTree(treenode->child,perm,size);
  }
  if (treenode->younger != (MtrNode *)0x0) {
    fixVarTree(treenode->younger,perm,size);
  }
  return;
}

Assistant:

static void
fixVarTree(
  MtrNode * treenode,
  int * perm,
  int  size)
{
    treenode->index = treenode->low;
    treenode->low = ((int) treenode->index < size) ?
        perm[treenode->index] : treenode->index;
    if (treenode->child != NULL)
        fixVarTree(treenode->child, perm, size);
    if (treenode->younger != NULL)
        fixVarTree(treenode->younger, perm, size);
    return;

}